

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PZMatrixMarket.cpp
# Opt level: O1

void TPZMatrixMarket::Read<std::complex<float>>
               (string *filename,TPZSBMatrix<std::complex<float>_> *fmat)

{
  char cVar1;
  istream *piVar2;
  int64_t nonzero;
  int64_t col;
  int64_t row;
  string buf;
  int64_t ncol;
  int64_t nrow;
  ifstream input;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  undefined8 local_250;
  undefined8 local_248;
  string *local_240;
  long local_238 [65];
  
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  local_278 = &local_268;
  local_270 = 0;
  local_268 = 0;
  cVar1 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_278,cVar1);
  piVar2 = std::istream::_M_extract<long>(local_238);
  piVar2 = std::istream::_M_extract<long>((long *)piVar2);
  std::istream::_M_extract<long>((long *)piVar2);
  local_240 = filename;
  if (local_278 != &local_268) {
    operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
  }
  std::ifstream::~ifstream(local_238);
  (*(fmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xe])(fmat,local_248,local_250);
  TPZSBMatrix<std::complex<float>_>::SetBand(fmat,0);
  std::ifstream::ifstream(local_238,(string *)local_240,_S_in);
  local_278 = &local_268;
  local_270 = 0;
  local_268 = 0;
  cVar1 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_278,cVar1);
  piVar2 = std::istream::_M_extract<long>(local_238);
  piVar2 = std::istream::_M_extract<long>((long *)piVar2);
  std::istream::_M_extract<long>((long *)piVar2);
  if (local_278 != &local_268) {
    operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void TPZMatrixMarket::Read(std::string filename, TPZSBMatrix<T>&fmat)
{
    int64_t nrow,ncol,nonzero=0,nsup=0,nlower=0, band=0;
    {
        std::ifstream input(filename);
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            if(row-col > band) band = row-col;
            if(col-row > band) band = col-row;
            row--;
            col--;
            if(row > col) nlower++;
            if(row< col ) nsup++;
        }
    }
    fmat.Redim(nrow,ncol);
    fmat.SetBand(band);
    {
        std::ifstream input(filename);
        std::string buf;
        std::getline(input,buf);
        input >> nrow >> ncol >> nonzero;
        for (int64_t el=0; el<nonzero; el++) {
            int64_t row, col;
            T val;
            input >> row >> col >> val;
            row--;
            col--;
            fmat.PutVal(row,col,val);
        }
    }
}